

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode.cpp
# Opt level: O2

bool equal<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>,std::__cxx11::u16string>
               (unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
                *r1,basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                    *r2)

{
  char *pcVar1;
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  __first2;
  iterator __first1;
  undefined1 auVar2 [32];
  bool bVar3;
  uint7 uStack_3f;
  iterator local_38;
  
  tcb::unicode::detail::
  unicode_view<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_char16_t>
  ::begin(&local_38,r1);
  pcVar1 = (r1->last_)._M_current;
  __first2._M_current = (r2->_M_dataplus)._M_p;
  __first1.first_._M_current = local_38.first_._M_current;
  __first1.next_chars_ = local_38.next_chars_;
  __first1.last_._M_current = local_38.last_._M_current;
  __first1.idx_ = local_38.idx_;
  __first1._25_7_ = local_38._25_7_;
  auVar2._8_8_ = pcVar1;
  auVar2._0_8_ = pcVar1;
  auVar2._16_8_ = (ulong)uStack_3f << 8;
  auVar2._24_8_ = 0;
  bVar3 = std::
          __equal4<tcb::unicode::detail::unicode_view<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,char16_t>::iterator,__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
                    (__first1,(iterator)(auVar2 << 0x40),__first2,
                     (__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                      )(__first2._M_current + r2->_M_string_length));
  return bVar3;
}

Assistant:

bool equal(const R1& r1, const R2& r2)
{
    return std::equal(std::cbegin(r1), std::cend(r1),
                      std::cbegin(r2), std::cend(r2));
}